

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImGuiTextBuffer::clear(ImGuiTextBuffer *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  char *__dest;
  ImGuiContext *pIVar4;
  int iVar5;
  char *pcVar6;
  
  pcVar6 = (this->Buf).Data;
  if (pcVar6 != (char *)0x0) {
    (this->Buf).Size = 0;
    pIVar4 = GImGui;
    (this->Buf).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar4->IO).MemFreeFn)(pcVar6);
    (this->Buf).Data = (char *)0x0;
  }
  pIVar4 = GImGui;
  iVar2 = (this->Buf).Size;
  if (iVar2 == 0) {
    iVar3 = 8;
  }
  else {
    iVar3 = iVar2 / 2 + iVar2;
  }
  iVar5 = iVar2 + 1;
  if (iVar2 + 1 < iVar3) {
    iVar5 = iVar3;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (char *)(*(pIVar4->IO).MemAllocFn)((long)iVar5);
  pcVar6 = (this->Buf).Data;
  if (pcVar6 != (char *)0x0) {
    memcpy(__dest,pcVar6,(long)(this->Buf).Size);
    pIVar4 = GImGui;
    pcVar6 = (this->Buf).Data;
    if (pcVar6 != (char *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      goto LAB_001715ad;
    }
  }
  pcVar6 = (char *)0x0;
  pIVar4 = GImGui;
LAB_001715ad:
  (*(pIVar4->IO).MemFreeFn)(pcVar6);
  (this->Buf).Data = __dest;
  (this->Buf).Capacity = iVar5;
  iVar2 = (this->Buf).Size;
  (this->Buf).Size = iVar2 + 1;
  __dest[iVar2] = '\0';
  return;
}

Assistant:

void                clear() { Buf.clear(); Buf.push_back(0); }